

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_file_open_append(int add_flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *__s1;
  undefined8 uVar6;
  __off64_t _Var7;
  void *pvVar8;
  void *pvVar9;
  undefined8 extraout_RAX;
  char *pcVar10;
  uv_fs_t *puVar11;
  undefined1 *puVar12;
  long unaff_R12;
  ulong uVar13;
  uv_fs_t *unaff_R14;
  long lVar14;
  void *pvVar15;
  char *pcVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uv_buf_t uVar19;
  undefined1 auStack_48a [2];
  code *pcStack_488;
  undefined8 uStack_480;
  void *pvStack_478;
  long lStack_470;
  undefined1 auStack_400 [16];
  undefined1 auStack_3f0 [16];
  undefined8 uStack_3d8;
  uv_fs_t *puStack_3d0;
  uv_fs_t *puStack_3c8;
  undefined8 uStack_3c0;
  code *pcStack_3b0;
  code *pcStack_3a8;
  undefined8 uStack_3a0;
  undefined1 auStack_390 [16];
  undefined1 auStack_380 [16];
  undefined1 auStack_370 [16];
  undefined1 auStack_360 [16];
  undefined1 auStack_350 [256];
  undefined1 auStack_250 [256];
  undefined1 auStack_150 [128];
  undefined1 auStack_d0 [136];
  undefined1 *puStack_48;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_0015776a:
    fs_file_open_append_cold_2();
LAB_0015776f:
    fs_file_open_append_cold_3();
LAB_00157774:
    fs_file_open_append_cold_4();
LAB_00157779:
    fs_file_open_append_cold_5();
LAB_0015777e:
    fs_file_open_append_cold_6();
LAB_00157783:
    fs_file_open_append_cold_7();
LAB_00157788:
    fs_file_open_append_cold_8();
LAB_0015778d:
    fs_file_open_append_cold_9();
LAB_00157792:
    fs_file_open_append_cold_10();
LAB_00157797:
    fs_file_open_append_cold_11();
LAB_0015779c:
    fs_file_open_append_cold_12();
LAB_001577a1:
    fs_file_open_append_cold_13();
LAB_001577a6:
    fs_file_open_append_cold_14();
LAB_001577ab:
    fs_file_open_append_cold_15();
LAB_001577b0:
    fs_file_open_append_cold_16();
LAB_001577b5:
    fs_file_open_append_cold_17();
LAB_001577ba:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015776a;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015776f;
    if (write_req.result < 0) goto LAB_00157774;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157779;
    if (close_req.result != 0) goto LAB_0015777e;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar2 < 0) goto LAB_00157783;
    if (open_req1.result._4_4_ < 0) goto LAB_00157788;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015778d;
    if (write_req.result < 0) goto LAB_00157792;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157797;
    if (close_req.result != 0) goto LAB_0015779c;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar2 < 0) goto LAB_001577a1;
    if (open_req1.result._4_4_ < 0) goto LAB_001577a6;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iov = uVar19;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_001577ab;
    if (read_req.result != 0x1a) goto LAB_001577b0;
    auVar18[0] = -(buf[10] == 'r');
    auVar18[1] = -(buf[0xb] == '\n');
    auVar18[2] = -(buf[0xc] == '\0');
    auVar18[3] = -(buf[0xd] == 't');
    auVar18[4] = -(buf[0xe] == 'e');
    auVar18[5] = -(buf[0xf] == 's');
    auVar18[6] = -(buf[0x10] == 't');
    auVar18[7] = -(buf[0x11] == '-');
    auVar18[8] = -(buf[0x12] == 'b');
    auVar18[9] = -(buf[0x13] == 'u');
    auVar18[10] = -(buf[0x14] == 'f');
    auVar18[0xb] = -(buf[0x15] == 'f');
    auVar18[0xc] = -(buf[0x16] == 'e');
    auVar18[0xd] = -(buf[0x17] == 'r');
    auVar18[0xe] = -(buf[0x18] == '\n');
    auVar18[0xf] = -(buf[0x19] == '\0');
    auVar17[0] = -(buf[0] == 't');
    auVar17[1] = -(buf[1] == 'e');
    auVar17[2] = -(buf[2] == 's');
    auVar17[3] = -(buf[3] == 't');
    auVar17[4] = -(buf[4] == '-');
    auVar17[5] = -(buf[5] == 'b');
    auVar17[6] = -(buf[6] == 'u');
    auVar17[7] = -(buf[7] == 'f');
    auVar17[8] = -(buf[8] == 'f');
    auVar17[9] = -(buf[9] == 'e');
    auVar17[10] = -(buf[10] == 'r');
    auVar17[0xb] = -(buf[0xb] == '\n');
    auVar17[0xc] = -(buf[0xc] == '\0');
    auVar17[0xd] = -(buf[0xd] == 't');
    auVar17[0xe] = -(buf[0xe] == 'e');
    auVar17[0xf] = -(buf[0xf] == 's');
    auVar17 = auVar17 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001577b5;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001577ba;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_open_append_cold_19();
  unlink("test_file");
  unlink("test_file2");
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00157b05:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00157b0a:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00157b0f:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00157b14:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00157b19:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00157b1e:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00157b23:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00157b28:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00157b2d:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00157b32:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00157b37:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00157b3c:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00157b41:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00157b46:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00157b4b:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00157b50:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00157b55:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00157b5a:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157b05;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157b0a;
    if (write_req.result < 0) goto LAB_00157b0f;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b14;
    if (close_req.result != 0) goto LAB_00157b19;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_00157b1e;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b23;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b28;
    if (close_req.result != 0) goto LAB_00157b2d;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_00157b32;
    if (rename_req.result != 0) goto LAB_00157b37;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_00157b3c;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b41;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157b46;
    if (read_req.result < 0) goto LAB_00157b4b;
    iVar4 = 0x2e3070;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00157b50;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b55;
    if (close_req.result != 0) goto LAB_00157b5a;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    iVar4 = uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar4);
  fs_read_bufs(iVar4);
  __s1 = (undefined1 *)uv_default_loop();
  uv_walk(__s1,close_walk_cb,0);
  uv_run(__s1,0);
  uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_3a8 = (code *)0x157bd3;
  puStack_48 = __s1;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_3a8 = (code *)0x157e0b;
    fs_read_bufs_cold_1();
LAB_00157e0b:
    pcStack_3a8 = (code *)0x157e10;
    fs_read_bufs_cold_2();
LAB_00157e10:
    pcStack_3a8 = (code *)0x157e15;
    fs_read_bufs_cold_3();
LAB_00157e15:
    pcStack_3a8 = (code *)0x157e1a;
    fs_read_bufs_cold_4();
LAB_00157e1a:
    pcStack_3a8 = (code *)0x157e1f;
    fs_read_bufs_cold_5();
LAB_00157e1f:
    pcStack_3a8 = (code *)0x157e24;
    fs_read_bufs_cold_6();
LAB_00157e24:
    pcStack_3a8 = (code *)0x157e29;
    fs_read_bufs_cold_7();
LAB_00157e29:
    pcStack_3a8 = (code *)0x157e2e;
    fs_read_bufs_cold_8();
LAB_00157e2e:
    pcStack_3a8 = (code *)0x157e33;
    fs_read_bufs_cold_9();
LAB_00157e33:
    pcStack_3a8 = (code *)0x157e38;
    fs_read_bufs_cold_10();
LAB_00157e38:
    pcStack_3a8 = (code *)0x157e3d;
    fs_read_bufs_cold_11();
LAB_00157e3d:
    pcStack_3a8 = (code *)0x157e42;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157e0b;
    pcStack_3a8 = (code *)0x157bf5;
    uv_fs_req_cleanup();
    uStack_3a0 = 0;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157c19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157e10;
    uStack_3a0 = 0;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157c49;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157e15;
    uStack_3a0 = 0;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157c79;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_390,0,0);
    if (iVar2 != -0x16) goto LAB_00157e1a;
    pcStack_3a8 = (code *)0x157c91;
    auStack_390 = uv_buf_init(auStack_350,0x100);
    __s1 = auStack_390;
    pcStack_3a8 = (code *)0x157caf;
    auStack_380 = uv_buf_init(auStack_250,0x100);
    pcStack_3a8 = (code *)0x157cc9;
    auStack_370 = uv_buf_init(auStack_150,0x80);
    pcStack_3a8 = (code *)0x157ce3;
    auStack_360 = uv_buf_init(auStack_d0,0x80);
    uStack_3a0 = 0;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157d13;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar2 != 0x1be) goto LAB_00157e1f;
    if (read_req.result != 0x1be) goto LAB_00157e24;
    __s1 = auStack_370;
    unaff_R14 = &read_req;
    pcStack_3a8 = (code *)0x157d43;
    uv_fs_req_cleanup();
    uStack_3a0 = 0;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157d6a;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157e29;
    if (read_req.result != 0xbe) goto LAB_00157e2e;
    pcStack_3a8 = (code *)0x157d92;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_380._0_8_;
    pcStack_3a8 = (code *)0x157da9;
    puVar12 = (undefined1 *)auStack_380._0_8_;
    iVar2 = bcmp((void *)auStack_380._0_8_,(void *)auStack_370._0_8_,0x80);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_00157e33;
    __s1 = __s1 + 0x80;
    pcStack_3a8 = (code *)0x157dc7;
    puVar12 = __s1;
    iVar2 = bcmp(__s1,(void *)auStack_360._0_8_,0x3e);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_00157e38;
    iVar4 = 0;
    pcStack_3a8 = (code *)0x157de1;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157e3d;
    if (close_req.result == 0) {
      pcStack_3a8 = (code *)0x157dfb;
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  pcStack_3a8 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_3b0 = (code *)0x157e4d;
  pcStack_3a8 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_3b0 = (code *)0x157e52;
  fs_read_file_eof(iVar4);
  pcStack_3b0 = (code *)0x157e57;
  uVar5 = uv_default_loop();
  pcStack_3b0 = (code *)0x157e6b;
  uv_walk(uVar5,close_walk_cb,0);
  pcStack_3b0 = (code *)0x157e75;
  uv_run(uVar5,0);
  pcStack_3b0 = (code *)0x157e7a;
  uVar6 = uv_default_loop();
  pcStack_3b0 = (code *)0x157e82;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    return;
  }
  pcStack_3b0 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar11 = (uv_fs_t *)0x184395;
  puStack_3c8 = (uv_fs_t *)0x157ea3;
  pcStack_3b0 = (code *)uVar5;
  unlink("test_file");
  puStack_3c8 = (uv_fs_t *)0x157ea8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_3c8 = (uv_fs_t *)0x157ece;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_3c8 = (uv_fs_t *)0x15812b;
    fs_read_file_eof_cold_1();
LAB_0015812b:
    puStack_3c8 = (uv_fs_t *)0x158130;
    fs_read_file_eof_cold_2();
LAB_00158130:
    puStack_3c8 = (uv_fs_t *)0x158135;
    fs_read_file_eof_cold_3();
LAB_00158135:
    puStack_3c8 = (uv_fs_t *)0x15813a;
    fs_read_file_eof_cold_4();
LAB_0015813a:
    puStack_3c8 = (uv_fs_t *)0x15813f;
    fs_read_file_eof_cold_5();
LAB_0015813f:
    puStack_3c8 = (uv_fs_t *)0x158144;
    fs_read_file_eof_cold_6();
LAB_00158144:
    puStack_3c8 = (uv_fs_t *)0x158149;
    fs_read_file_eof_cold_7();
LAB_00158149:
    puStack_3c8 = (uv_fs_t *)0x15814e;
    fs_read_file_eof_cold_8();
LAB_0015814e:
    puStack_3c8 = (uv_fs_t *)0x158153;
    fs_read_file_eof_cold_9();
LAB_00158153:
    puStack_3c8 = (uv_fs_t *)0x158158;
    fs_read_file_eof_cold_10();
LAB_00158158:
    puStack_3c8 = (uv_fs_t *)0x15815d;
    fs_read_file_eof_cold_11();
LAB_0015815d:
    puStack_3c8 = (uv_fs_t *)0x158162;
    fs_read_file_eof_cold_12();
LAB_00158162:
    puStack_3c8 = (uv_fs_t *)0x158167;
    fs_read_file_eof_cold_13();
LAB_00158167:
    puStack_3c8 = (uv_fs_t *)0x15816c;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015812b;
    puStack_3c8 = (uv_fs_t *)0x157ef0;
    uv_fs_req_cleanup(&open_req1);
    puStack_3c8 = (uv_fs_t *)0x157f01;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3c0 = 0;
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x157f3f;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158130;
    if (write_req.result < 0) goto LAB_00158135;
    puStack_3c8 = (uv_fs_t *)0x157f61;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x157f77;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015813a;
    if (close_req.result != 0) goto LAB_0015813f;
    puStack_3c8 = (uv_fs_t *)0x157f99;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x157fb6;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158144;
    if (open_req1.result._4_4_ < 0) goto LAB_00158149;
    puStack_3c8 = (uv_fs_t *)0x157fd8;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3c8 = (uv_fs_t *)0x157ffa;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c0 = 0;
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x158038;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015814e;
    if (read_req.result < 0) goto LAB_00158153;
    iVar4 = 0x2e3070;
    puStack_3c8 = (uv_fs_t *)0x158061;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158158;
    puVar11 = &read_req;
    puStack_3c8 = (uv_fs_t *)0x158078;
    uv_fs_req_cleanup(&read_req);
    puStack_3c8 = (uv_fs_t *)0x158089;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c0 = 0;
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x1580c3;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_0015815d;
    if (read_req.result != 0) goto LAB_00158162;
    puStack_3c8 = (uv_fs_t *)0x1580e5;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x1580fb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158167;
    if (close_req.result == 0) {
      puStack_3c8 = (uv_fs_t *)0x158115;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_3c8 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3d0 = (uv_fs_t *)0x158177;
  puStack_3c8 = puVar11;
  fs_write_multiple_bufs(iVar4);
  puStack_3d0 = (uv_fs_t *)0x15817c;
  fs_write_multiple_bufs(iVar4);
  puStack_3d0 = (uv_fs_t *)0x158181;
  uVar5 = uv_default_loop();
  puStack_3d0 = (uv_fs_t *)0x158195;
  uv_walk(uVar5,close_walk_cb,0);
  puStack_3d0 = (uv_fs_t *)0x15819f;
  uv_run(uVar5,0);
  puStack_3d0 = (uv_fs_t *)0x1581a4;
  uVar6 = uv_default_loop();
  puStack_3d0 = (uv_fs_t *)0x1581ac;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    return;
  }
  puStack_3d0 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_3d8 = uVar5;
  puStack_3d0 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015864c:
    fs_write_multiple_bufs_cold_2();
LAB_00158651:
    fs_write_multiple_bufs_cold_3();
LAB_00158656:
    fs_write_multiple_bufs_cold_4();
LAB_0015865b:
    fs_write_multiple_bufs_cold_5();
LAB_00158660:
    fs_write_multiple_bufs_cold_6();
LAB_00158665:
    fs_write_multiple_bufs_cold_7();
LAB_0015866a:
    fs_write_multiple_bufs_cold_8();
LAB_0015866f:
    fs_write_multiple_bufs_cold_9();
LAB_00158674:
    fs_write_multiple_bufs_cold_10();
LAB_00158679:
    fs_write_multiple_bufs_cold_11();
LAB_0015867e:
    fs_write_multiple_bufs_cold_12();
LAB_00158683:
    fs_write_multiple_bufs_cold_13();
LAB_00158688:
    fs_write_multiple_bufs_cold_14();
LAB_0015868d:
    fs_write_multiple_bufs_cold_15();
LAB_00158692:
    fs_write_multiple_bufs_cold_16();
LAB_00158697:
    fs_write_multiple_bufs_cold_19();
LAB_0015869c:
    fs_write_multiple_bufs_cold_20();
LAB_001586a1:
    fs_write_multiple_bufs_cold_21();
LAB_001586a6:
    fs_write_multiple_bufs_cold_22();
LAB_001586ab:
    fs_write_multiple_bufs_cold_23();
LAB_001586b0:
    fs_write_multiple_bufs_cold_24();
LAB_001586b5:
    fs_write_multiple_bufs_cold_25();
LAB_001586ba:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015864c;
    uv_fs_req_cleanup(&open_req1);
    auStack_400 = uv_buf_init(test_buf,0xd);
    auStack_3f0 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_400,2,0);
    if (iVar4 < 0) goto LAB_00158651;
    if (write_req.result < 0) goto LAB_00158656;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_0015865b;
    if (close_req.result != 0) goto LAB_00158660;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158665;
    if (open_req1.result._4_4_ < 0) goto LAB_0015866a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar17 = uv_buf_init(buf,0xd);
    auStack_400 = auVar17;
    auVar17 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_3f0 = auVar17;
    _Var7 = lseek64((int)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_0015866f;
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_400,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158674;
    if (read_req.result != 0x1c) goto LAB_00158679;
    iVar2 = 0x2e3070;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015867e;
    iVar2 = 0x2e4460;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00158683;
    uv_fs_req_cleanup(&read_req);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158688;
    if (read_req.result != 0) goto LAB_0015868d;
    uv_fs_req_cleanup(&read_req);
    auVar17 = uv_buf_init(buf,0xd);
    auStack_400 = auVar17;
    auVar17 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_3f0 = auVar17;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_400,2,0);
    if (iVar4 < 0) goto LAB_00158692;
    if (read_req.result == 0x1c) {
LAB_0015854a:
      iVar2 = 0x2e3070;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00158697;
      iVar2 = 0x2e4460;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_0015869c;
      uv_fs_req_cleanup(&read_req);
      uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar19;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_001586a1;
      if (read_req.result != 0) goto LAB_001586a6;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_001586ab;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001586b0;
    }
    if (read_req.result != 0xd) goto LAB_001586b5;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3f0,1,read_req.result);
    if (iVar4 < 0) goto LAB_001586ba;
    if (read_req.result == 0xf) goto LAB_0015854a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar14 = 8;
    do {
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar9 = malloc(0xac67d);
    if (pvVar9 == (void *)0x0) goto LAB_00158a55;
    lVar14 = 8;
    pvVar15 = pvVar9;
    do {
      auVar17 = uv_buf_init(pvVar15,0xd);
      *(long *)((long)pvVar8 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
      pvVar15 = (void *)((long)pvVar15 + 0xd);
    } while (lVar14 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar10 = (char *)((long)pvVar9 + unaff_R12);
      iVar4 = strncmp(pcVar10,test_buf,0xd);
      iVar2 = (int)pcVar10;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar9);
    iVar2 = (int)open_req1.result;
    _Var7 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00158a78;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar8);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar8 = (void *)uv_default_loop();
  uv_walk(pvVar8,close_walk_cb,0);
  uv_run(pvVar8,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_488 = (code *)0x158af0;
  uStack_480 = extraout_RAX;
  pvStack_478 = pvVar8;
  lStack_470 = unaff_R12;
  unlink("test_file");
  pcStack_488 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_488 = (code *)0x158b06;
  pvVar9 = malloc(0xd4310);
  if (pvVar9 == (void *)0x0) {
LAB_00158e4b:
    pvVar9 = pvVar8;
    pcStack_488 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_488 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_488 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_488 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_488 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_488 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_488 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_488 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_488 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_488 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_488 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_488 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_488 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_488 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_488 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_488 = (code *)0x158b35;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_488 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_488 = (code *)0x158b68;
    uVar19 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_480 = 0;
    pcStack_488 = (code *)0x158ba6;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_488 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar14 = 8;
    do {
      pcStack_488 = (code *)0x158be3;
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar9 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0xd4318);
    uStack_480 = 0;
    pcStack_488 = (code *)0x158c24;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_488 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_488 = (code *)0x158c53;
    pcVar10 = (char *)malloc(0xac67d);
    if (pcVar10 == (char *)0x0) goto LAB_00158e6e;
    lVar14 = 8;
    pcVar16 = pcVar10;
    do {
      pcStack_488 = (code *)0x158c75;
      auVar17 = uv_buf_init(pcVar16,0xd);
      *(long *)((long)pvVar9 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
      pcVar16 = pcVar16 + 0xd;
    } while (lVar14 != 0xd4318);
    uStack_480 = 0;
    pcStack_488 = (code *)0x158cba;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e73;
    lVar14 = 0xd;
    if (iVar2 != 0xd) {
      lVar14 = 0x3400;
    }
    if (read_req.result != lVar14) goto LAB_00158e78;
    pcVar16 = pcVar10;
    uVar13 = 0;
    do {
      pcStack_488 = (code *)0x158cff;
      iVar4 = strncmp(pcVar16,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_488 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar8 = pvVar9;
        goto LAB_00158e4b;
      }
      if (iVar2 == 0xd) break;
      pcVar16 = pcVar16 + 0xd;
      bVar1 = uVar13 < 0x3ff;
      uVar13 = uVar13 + 1;
    } while (bVar1);
    pcStack_488 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_488 = (code *)0x158d34;
    free(pcVar10);
    pcStack_488 = (code *)0x158d4b;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar2 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_488 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_488 = (code *)0x158d8c;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_480 = 0;
    pcStack_488 = (code *)0x158dce;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar2 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_488 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_488 = (code *)0x158e06;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_488 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_488 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar9);
      return;
    }
  }
  pcStack_488 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_488 = (code *)pvVar9;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(auStack_48a,2);
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_file_open_append(int add_flags) {
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_RDWR | O_APPEND | add_flags, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags,
      S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  printf("read = %d\n", r);
  ASSERT(r == 26);
  ASSERT(read_req.result == 26);
  ASSERT(memcmp(buf,
                "test-buffer\n\0test-buffer\n\0",
                sizeof("test-buffer\n\0test-buffer\n\0") - 1) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}